

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall
Memory::Recycler::Recycler
          (Recycler *this,AllocationPolicyManager *policyManager,
          IdleDecommitPageAllocator *pageAllocator,_func_void *outOfMemoryFunc,
          ConfigFlagsTable *configFlagsTable,RecyclerTelemetryHostInterface *hostInterface)

{
  HeapInfoManager *this_00;
  ConfigFlagsTable *this_01;
  AsymetricResizeLock *pAVar1;
  bool bVar2;
  uint uVar3;
  DWORD DVar4;
  HeapAllocator *pHVar5;
  HANDLE processHandle;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  
  (this->collectionStateChangedObserver).super_ObservableValueObserver<Memory::CollectionState>.
  _vptr_ObservableValueObserver = (_func_int **)&PTR_ValueChanged_014d9980;
  (this->collectionStateChangedObserver).recycler = this;
  (this->collectionState).value = CollectionStateNotCollecting;
  (this->collectionState).observer =
       &(this->collectionStateChangedObserver).
        super_ObservableValueObserver<Memory::CollectionState>;
  this->threadService = (ThreadService *)0x0;
  HeapBlockMap64::HeapBlockMap64(&this->heapBlockMap);
  pHVar5 = HeapAllocator::GetNoMemProtectInstance();
  (this->pinnedObjectMap).allocator = pHVar5;
  (this->pinnedObjectMap).count = 0;
  (this->pinnedObjectMap).freecount = 0;
  (this->pinnedObjectMap).modFunctionIndex = 0x4b;
  uVar3 = PrimePolicy::GetPrime(0x400,&(this->pinnedObjectMap).modFunctionIndex);
  (this->pinnedObjectMap).size = uVar3;
  SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
  ::Initialize(&this->pinnedObjectMap);
  pHVar5 = HeapAllocator::GetNoMemProtectInstance();
  WeakReferenceHashTable<PrimePolicy>::WeakReferenceHashTable(&this->weakReferenceMap,0x400,pHVar5);
  this->weakReferenceCleanupId = 0;
  pHVar5 = HeapAllocator::GetNoMemProtectInstance();
  (this->weakReferenceRegionList).
  super_SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>.
  super_SListNodeBase<Memory::HeapAllocator>.next = (Type)&this->weakReferenceRegionList;
  (this->weakReferenceRegionList).
  super_SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>.
  super_RealCount.count = 0;
  (this->weakReferenceRegionList).allocator = pHVar5;
  this->transientPinnedObject = (void *)0x0;
  (this->guestArenaList).super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>.next.base =
       &(this->guestArenaList).super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>;
  (this->guestArenaList).super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>.prev.base =
       &(this->guestArenaList).super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>;
  (this->guestArenaList).super_RealCount.count = 0;
  (this->externalGuestArenaList).super_DListNodeBase<Memory::ArenaData_*>.next.base =
       &(this->externalGuestArenaList).super_DListNodeBase<Memory::ArenaData_*>;
  (this->externalGuestArenaList).super_DListNodeBase<Memory::ArenaData_*>.prev.base =
       &(this->externalGuestArenaList).super_DListNodeBase<Memory::ArenaData_*>;
  (this->externalGuestArenaList).super_RealCount.count = 0;
  this->isPageHeapEnabled = false;
  this->capturePageHeapAllocStack = false;
  this->capturePageHeapFreeStack = false;
  MarkContext::MarkContext(&this->markContext,this,&this->markPagePool);
  MarkContext::MarkContext(&this->parallelMarkContext1,this,&this->parallelMarkPagePool1);
  MarkContext::MarkContext(&this->parallelMarkContext2,this,&this->parallelMarkPagePool2);
  MarkContext::MarkContext(&this->parallelMarkContext3,this,&this->parallelMarkPagePool3);
  PagePool::PagePool(&this->markPagePool,configFlagsTable);
  PagePool::PagePool(&this->parallelMarkPagePool1,configFlagsTable);
  PagePool::PagePool(&this->parallelMarkPagePool2,configFlagsTable);
  PagePool::PagePool(&this->parallelMarkPagePool3,configFlagsTable);
  this->collectionWrapper =
       &DefaultRecyclerCollectionWrapper::Instance.super_RecyclerCollectionWrapper;
  this->mainThreadHandle = (HANDLE)0x0;
  (this->savedThreadContext).registers[0] = (void *)0x0;
  (this->savedThreadContext).registers[1] = (void *)0x0;
  (this->savedThreadContext).registers[2] = (void *)0x0;
  (this->savedThreadContext).registers[3] = (void *)0x0;
  (this->savedThreadContext).registers[4] = (void *)0x0;
  (this->savedThreadContext).registers[5] = (void *)0x0;
  (this->savedThreadContext).registers[6] = (void *)0x0;
  (this->savedThreadContext).registers[7] = (void *)0x0;
  (this->savedThreadContext).registers[8] = (void *)0x0;
  (this->savedThreadContext).registers[9] = (void *)0x0;
  (this->savedThreadContext).registers[10] = (void *)0x0;
  (this->savedThreadContext).registers[0xb] = (void *)0x0;
  (this->savedThreadContext).registers[0xc] = (void *)0x0;
  (this->savedThreadContext).registers[0xd] = (void *)0x0;
  (this->savedThreadContext).registers[0xe] = (void *)0x0;
  (this->savedThreadContext).registers[0xf] = (void *)0x0;
  this->allowDispose = false;
  this->inDisposeWrapper = false;
  this->needOOMRescan = false;
  this->needExternalWrapperTracing = false;
  this->hasDisposableObject = false;
  this->hasNativeGCHost = false;
  this->isScriptActive = false;
  this->isInScript = false;
  this->isShuttingDown = false;
  this->scanPinnedObjectMap = false;
  this->tickCountNextDispose = 0;
  this->inExhaustiveCollection = false;
  this->hasExhaustiveCandidate = false;
  this->inCacheCleanupCollection = false;
  this->inDecommitNowCollection = false;
  this->hasPendingUnpinnedObject = false;
  this->hasPendingDeleteGuestArena = false;
  this->inEndMarkOnLowMemory = false;
  this->decommitOnFinish = false;
  this->enableScanInteriorPointers = configFlagsTable->RecyclerForceMarkInterior;
  this->enableScanImplicitRoots = false;
  this->disableCollectOnAllocationHeuristics = false;
  this->enableConcurrentMark = false;
  this->enableParallelMark = false;
  this->enableConcurrentSweep = false;
  this->backgroundFinishMarkCount = '\0';
  this->inPartialCollectMode = false;
  this->hasBackgroundFinishPartial = false;
  this->partialConcurrentNextCollection = false;
  this->forcePartialScanStack = false;
  this->isExternalStackSkippingGC = false;
  this->skipStack = false;
  this->isConcurrentGCOnIdle = false;
  this->isFinishGCOnIdle = false;
  this->isFinishGCOnIdle = false;
  this->queueTrackedObject = false;
  this->hasPendingConcurrentFindRoot = false;
  this->priorityBoost = false;
  this->concurrentWorkReadyEvent = (HANDLE)0x0;
  this->concurrentWorkDoneEvent = (HANDLE)0x0;
  this->concurrentThread = (HANDLE)0x0;
  (this->parallelThread1).workFunc = (WorkFunc)ParallelWorkFunc<0u>;
  *(undefined8 *)&(this->parallelThread1).field_0x8 = 0;
  (this->parallelThread1).recycler = this;
  (this->parallelThread1).concurrentWorkReadyEvent = (HANDLE)0x0;
  (this->parallelThread1).concurrentWorkDoneEvent = (HANDLE)0x0;
  (this->parallelThread1).concurrentThread = (HANDLE)0x0;
  (this->parallelThread2).workFunc = (WorkFunc)ParallelWorkFunc<1u>;
  *(undefined8 *)&(this->parallelThread2).field_0x8 = 0;
  (this->parallelThread2).recycler = this;
  (this->parallelThread2).concurrentThread = (HANDLE)0x0;
  (this->parallelThread2).concurrentWorkReadyEvent = (HANDLE)0x0;
  (this->parallelThread2).concurrentWorkDoneEvent = (HANDLE)0x0;
  this->concurrentThreadExited = true;
  this->isProcessingTrackedObjects = false;
  this->isAborting = false;
  this->hasIncompleteDoCollect = false;
  this->isProcessingRescan = false;
  this->recyclerFlagsTable = configFlagsTable;
  this->recyclerSweepManager = (RecyclerSweepManager *)0x0;
  this->concurrentIdleDecommitEvent = (HANDLE)0x0;
  (this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &(this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>;
  (this->clientTrackedObjectList).super_RealCount.count = 0;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&(this->clientTrackedObjectAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,L"CTO-List",
             &pageAllocator->super_PageAllocator,Js::Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  this->partialUncollectedAllocBytes = 0;
  this->uncollectedNewPageCountPartialCollect = 0xffffffffffffffff;
  this->outOfMemoryFunc = outOfMemoryFunc;
  this->checkFn = (_func_BOOL_char_ptr_size_t *)0x0;
  this->externalRootMarker = (ExternalRootMarker)0x0;
  this->externalRootMarkerContext = (void *)0x0;
  this->profiler = (Profiler *)0x0;
  this->backgroundProfiler = (Profiler *)0x0;
  processHandle = GetCurrentProcess();
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::PageAllocatorBase(&this->backgroundProfilerPageAllocator,(AllocationPolicyManager *)0x0,
                      configFlagsTable,PageAllocatorType_GCThread,0x400,false,
                      (BackgroundPageQueue *)0x0,0x20,0,false,false,processHandle,false);
  (this->backgroundProfilerArena).super_DListNodeBase<Memory::ArenaAllocator>.next.base =
       &(this->backgroundProfilerArena).super_DListNodeBase<Memory::ArenaAllocator>;
  (this->backgroundProfilerArena).super_DListNodeBase<Memory::ArenaAllocator>.prev.base =
       &(this->backgroundProfilerArena).super_DListNodeBase<Memory::ArenaAllocator>;
  (this->backgroundProfilerArena).super_RealCount.count = 0;
  this_00 = &this->autoHeap;
  HeapInfoManager::HeapInfoManager(this_00,policyManager,configFlagsTable,pageAllocator);
  this->memoryData = (RecyclerMemoryData *)0x0;
  this->objectGraphDumper = (RecyclerObjectGraphDumper *)0x0;
  this->dumpObjectOnceOnCollect = false;
  (this->blockCache).heapBlock = (HeapBlock *)0x0;
  (this->blockCache).candidate = (void *)0x0;
  this->isPrimaryMarkContextInitialized = false;
  this->objectBeforeCollectCallbackList = (ObjectBeforeCollectCallbackList *)0x0;
  this->trackerDictionary = (TypeInfotoTrackerItemMap *)0x0;
  this->trackerCriticalSection = (CriticalSection *)0x0;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&(this->objectBeforeCollectCallbackArena).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             L"BeforeCollect-List",&pageAllocator->super_PageAllocator,Js::Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  this->objectBeforeCollectCallbackState = ObjectBeforeCollectCallback_None;
  pAVar1 = &(this->pendingWriteBarrierBlockMap).super_AsymetricResizeLock;
  (pAVar1->cs).super_CCLock.mutexPtr[0] = '\0';
  (pAVar1->cs).super_CCLock.mutexPtr[1] = '\0';
  (pAVar1->cs).super_CCLock.mutexPtr[2] = '\0';
  (pAVar1->cs).super_CCLock.mutexPtr[3] = '\0';
  (pAVar1->cs).super_CCLock.mutexPtr[4] = '\0';
  (pAVar1->cs).super_CCLock.mutexPtr[5] = '\0';
  (pAVar1->cs).super_CCLock.mutexPtr[6] = '\0';
  (pAVar1->cs).super_CCLock.mutexPtr[7] = '\0';
  CCLock::Reset((CCLock *)&this->pendingWriteBarrierBlockMap,true);
  (this->pendingWriteBarrierBlockMap).buckets = (Type)0x0;
  (this->pendingWriteBarrierBlockMap).entries = (Type)0x0;
  (this->pendingWriteBarrierBlockMap).alloc = &HeapAllocator::Instance;
  (this->pendingWriteBarrierBlockMap).size = 0;
  (this->pendingWriteBarrierBlockMap).bucketCount = 0;
  (this->pendingWriteBarrierBlockMap).count = 0;
  (this->pendingWriteBarrierBlockMap).freeCount = 0;
  (this->pendingWriteBarrierBlockMap).modFunctionIndex = 0x4b;
  (this->pendingWriteBarrierBlockMap).stats = (Type)0x0;
  this->verifyPad = this->recyclerFlagsTable->RecyclerVerifyPadSize;
  bVar2 = Js::ConfigFlagsTable::IsEnabled(this->recyclerFlagsTable,RecyclerVerifyFlag);
  this->verifyEnabled = bVar2;
  if (bVar2) {
    HeapInfoManager::EnableVerify(this_00);
  }
  if (this->recyclerFlagsTable->RecyclerNoPageReuse == true) {
    HeapInfoManager::DisablePageReuse(this_00);
  }
  this->inDispose = false;
  this->heapBlockCount = 0;
  this->disableThreadAccessCheck = false;
  this->isForceSweeping = false;
  this->disableConcurrentThreadExitedCheck = false;
  this->collectionCount = 0;
  (this->collectionStats).finalizeCount = 0;
  RecyclerMemoryTracking::ReportRecyclerCreate(this);
  this->isCollectionDisabled = false;
  this->forceTraceMark = false;
  this->isHeapEnumInProgress = false;
  this->allowAllocationDuringHeapEnum = false;
  this->allowAllocationDuringRenentrance = false;
  DVar4 = GetTickCount();
  this->tickCountNextCollection = DVar4 + 0x4b0;
  DVar4 = GetTickCount();
  this->tickCountNextFinishCollection = DVar4 + 0x2d;
  this->inDllCanUnloadNow = false;
  this->inDetachProcess = false;
  this_01 = this->recyclerFlagsTable;
  uVar6 = (ulong)this_01->MaxMarkStackPageCount;
  uVar8 = 2;
  if (2 < uVar6) {
    uVar8 = uVar6;
  }
  (this->markContext).markStack.maxPageCount = uVar8;
  (this->markContext).trackStack.maxPageCount = uVar8;
  sVar7 = uVar6 + (uVar6 == 0);
  (this->parallelMarkContext1).markStack.maxPageCount = sVar7;
  (this->parallelMarkContext1).trackStack.maxPageCount = sVar7;
  (this->parallelMarkContext2).markStack.maxPageCount = sVar7;
  (this->parallelMarkContext2).trackStack.maxPageCount = sVar7;
  (this->parallelMarkContext3).markStack.maxPageCount = sVar7;
  (this->parallelMarkContext3).trackStack.maxPageCount = sVar7;
  bVar2 = Js::ConfigFlagsTable::IsEnabled(this_01,GCMemoryThresholdFlag);
  if (bVar2) {
    RecyclerHeuristic::ConfigureBaseFactor
              (&RecyclerHeuristic::Instance,this->recyclerFlagsTable->GCMemoryThreshold);
  }
  return;
}

Assistant:

Recycler::Recycler(AllocationPolicyManager * policyManager, IdleDecommitPageAllocator * pageAllocator, void (*outOfMemoryFunc)(), Js::ConfigFlagsTable& configFlagsTable, RecyclerTelemetryHostInterface* hostInterface) :
    collectionStateChangedObserver(this),
    collectionState(CollectionStateNotCollecting, &collectionStateChangedObserver),
    recyclerFlagsTable(configFlagsTable),
    autoHeap(policyManager, configFlagsTable, pageAllocator),
#ifdef ENABLE_JS_ETW
    collectionStartReason(ETWEventGCActivationTrigger::ETWEvent_GC_Trigger_Unknown),
    collectionFinishReason(ETWEventGCActivationTrigger::ETWEvent_GC_Trigger_Unknown),
#endif
    threadService(nullptr),
    markPagePool(configFlagsTable),
    parallelMarkPagePool1(configFlagsTable),
    parallelMarkPagePool2(configFlagsTable),
    parallelMarkPagePool3(configFlagsTable),
    markContext(this, &this->markPagePool),
    parallelMarkContext1(this, &this->parallelMarkPagePool1),
    parallelMarkContext2(this, &this->parallelMarkPagePool2),
    parallelMarkContext3(this, &this->parallelMarkPagePool3),
#if ENABLE_PARTIAL_GC
    clientTrackedObjectAllocator(_u("CTO-List"), pageAllocator, Js::Throw::OutOfMemory),
#endif
    outOfMemoryFunc(outOfMemoryFunc),
#ifdef RECYCLER_TEST_SUPPORT
    checkFn(NULL),
#endif
    externalRootMarker(NULL),
    externalRootMarkerContext(NULL),
    recyclerSweepManager(nullptr),
    inEndMarkOnLowMemory(false),
    enableScanInteriorPointers(CUSTOM_CONFIG_FLAG(configFlagsTable, RecyclerForceMarkInterior)),
    enableScanImplicitRoots(false),
    disableCollectOnAllocationHeuristics(false),
    skipStack(false),
    mainThreadHandle(NULL),
#if ENABLE_CONCURRENT_GC
    backgroundFinishMarkCount(0),
    hasPendingUnpinnedObject(false),
    hasPendingConcurrentFindRoot(false),
    queueTrackedObject(false),
    enableConcurrentMark(false),  // Default to non-concurrent
    enableParallelMark(false),
    enableConcurrentSweep(false),
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    allowAllocationsDuringConcurrentSweepForCollection(false),
#endif
    concurrentThread(NULL),
    concurrentWorkReadyEvent(NULL),
    concurrentWorkDoneEvent(NULL),
    parallelThread1(this, &Recycler::ParallelWorkFunc<0>),
    parallelThread2(this, &Recycler::ParallelWorkFunc<1>),
    priorityBoost(false),
    isAborting(false),
#if DBG
    concurrentThreadExited(true),
    isProcessingTrackedObjects(false),
    hasIncompleteDoCollect(false),
    isConcurrentGCOnIdle(false),
    isFinishGCOnIdle(false),
#endif
#ifdef IDLE_DECOMMIT_ENABLED
    concurrentIdleDecommitEvent(nullptr),
#endif
#endif
#if DBG
    isExternalStackSkippingGC(false),
    isProcessingRescan(false),
#endif
#if ENABLE_PARTIAL_GC
    inPartialCollectMode(false),
    scanPinnedObjectMap(false),
    partialUncollectedAllocBytes(0),
    uncollectedNewPageCountPartialCollect((size_t)-1),
#if ENABLE_CONCURRENT_GC
    partialConcurrentNextCollection(false),
#endif
#ifdef RECYCLER_STRESS
    forcePartialScanStack(false),
#endif
#endif
#if defined(RECYCLER_DUMP_OBJECT_GRAPH) || defined(LEAK_REPORT) || defined(CHECK_MEMORY_LEAK)
    isPrimaryMarkContextInitialized(false),
#endif
    allowDispose(false),
    inDisposeWrapper(false),
    hasDisposableObject(false),
    hasNativeGCHost(false),
    needExternalWrapperTracing(false),
    tickCountNextDispose(0),
    transientPinnedObject(nullptr),
    pinnedObjectMap(1024, HeapAllocator::GetNoMemProtectInstance()),
    weakReferenceMap(1024, HeapAllocator::GetNoMemProtectInstance()),
    weakReferenceCleanupId(0),
#if ENABLE_WEAK_REFERENCE_REGIONS
    weakReferenceRegionList(HeapAllocator::GetNoMemProtectInstance()),
#endif
    collectionWrapper(&DefaultRecyclerCollectionWrapper::Instance),
    isScriptActive(false),
    isInScript(false),
    isShuttingDown(false),
    inExhaustiveCollection(false),
    hasExhaustiveCandidate(false),
    inDecommitNowCollection(false),
    inCacheCleanupCollection(false),
    hasPendingDeleteGuestArena(false),
    needOOMRescan(false),
#if ENABLE_CONCURRENT_GC && ENABLE_PARTIAL_GC
    hasBackgroundFinishPartial(false),
#endif
    decommitOnFinish(false)
#ifdef PROFILE_EXEC
    , profiler(nullptr)
    , backgroundProfiler(nullptr)
    , backgroundProfilerPageAllocator(nullptr, configFlagsTable, PageAllocatorType_GCThread)
    , backgroundProfilerArena()
#endif
#ifdef PROFILE_MEM
    , memoryData(nullptr)
#endif
#ifdef RECYCLER_DUMP_OBJECT_GRAPH
    , objectGraphDumper(nullptr)
    , dumpObjectOnceOnCollect(false)
#endif
#ifdef PROFILE_RECYCLER_ALLOC
    , trackerDictionary(nullptr)
#endif
#ifdef HEAP_ENUMERATION_VALIDATION
    ,pfPostHeapEnumScanCallback(nullptr)
#endif
#ifdef NTBUILD
    , telemetryBlock(&localTelemetryBlock)
#endif
#ifdef ENABLE_BASIC_TELEMETRY
    , telemetryStats(this, hostInterface)
#endif
#ifdef ENABLE_JS_ETW
    ,bulkFreeMemoryWrittenCount(0)
#endif
#ifdef RECYCLER_PAGE_HEAP
    , isPageHeapEnabled(false)
    , capturePageHeapAllocStack(false)
    , capturePageHeapFreeStack(false)
#endif
    , objectBeforeCollectCallbackList(nullptr)
    , objectBeforeCollectCallbackState(ObjectBeforeCollectCallback_None)
    , objectBeforeCollectCallbackArena(_u("BeforeCollect-List"), pageAllocator, Js::Throw::OutOfMemory)
#if GLOBAL_ENABLE_WRITE_BARRIER
    , pendingWriteBarrierBlockMap(&HeapAllocator::Instance)
#endif
#ifdef PROFILE_RECYCLER_ALLOC
    , trackerCriticalSection(nullptr)
#endif
{

#ifdef ENABLE_BASIC_TELEMETRY

    if (CoCreateGuid(&recyclerID) != S_OK)
    {
        // CoCreateGuid failed
        recyclerID = { 0 };
    }

    this->GetHeapInfo()->GetRecyclerPageAllocator()->SetDecommitStats(this->GetRecyclerTelemetryInfo().GetThreadPageAllocator_decommitStats());
    this->GetHeapInfo()->GetRecyclerLeafPageAllocator()->SetDecommitStats(this->GetRecyclerTelemetryInfo().GetRecyclerLeafPageAllocator_decommitStats());
    this->GetHeapInfo()->GetRecyclerLargeBlockPageAllocator()->SetDecommitStats(this->GetRecyclerTelemetryInfo().GetRecyclerLargeBlockPageAllocator_decommitStats());
#ifdef RECYCLER_WRITE_BARRIER_ALLOC_SEPARATE_PAGE
    this->GetHeapInfo()->GetRecyclerWithBarrierPageAllocator()->SetDecommitStats(this->GetRecyclerTelemetryInfo().GetRecyclerWithBarrierPageAllocator_decommitStats());
#endif
#endif

#ifdef RECYCLER_MARK_TRACK
    this->markMap = NoCheckHeapNew(MarkMap, &NoCheckHeapAllocator::Instance, 163, &markMapCriticalSection);
    markContext.SetMarkMap(markMap);
    parallelMarkContext1.SetMarkMap(markMap);
    parallelMarkContext2.SetMarkMap(markMap);
    parallelMarkContext3.SetMarkMap(markMap);
#endif

#ifdef RECYCLER_MEMORY_VERIFY
    verifyPad =  GetRecyclerFlagsTable().RecyclerVerifyPadSize;
    verifyEnabled =  GetRecyclerFlagsTable().IsEnabled(Js::RecyclerVerifyFlag);
    if (verifyEnabled)
    {
        autoHeap.EnableVerify();
    }
#endif

#ifdef RECYCLER_NO_PAGE_REUSE
    if (GetRecyclerFlagsTable().RecyclerNoPageReuse)
    {
        autoHeap.DisablePageReuse();
    }
#endif

    this->inDispose = false;

#if DBG
    this->heapBlockCount = 0;
    this->disableThreadAccessCheck = false;
#if ENABLE_CONCURRENT_GC
    this->disableConcurrentThreadExitedCheck = false;
#endif
#endif
#if DBG || defined RECYCLER_TRACE
    this->collectionCount = 0;
#endif
#if DBG || defined(RECYCLER_STATS)
    isForceSweeping = false;
#endif
#ifdef RECYCLER_FINALIZE_CHECK
    collectionStats.finalizeCount = 0;
#endif
    RecyclerMemoryTracking::ReportRecyclerCreate(this);
#if DBG_DUMP
    forceTraceMark = false;
#endif
    isHeapEnumInProgress = false;
    isCollectionDisabled = false;
#if DBG
    allowAllocationDuringRenentrance = false;
    allowAllocationDuringHeapEnum = false;
#endif
    ScheduleNextCollection();
#if defined(RECYCLER_DUMP_OBJECT_GRAPH) ||  defined(LEAK_REPORT) || defined(CHECK_MEMORY_LEAK)
    this->inDllCanUnloadNow = false;
    this->inDetachProcess = false;
#endif

#ifdef NTBUILD
    memset(&localTelemetryBlock, 0, sizeof(localTelemetryBlock));
#endif

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    // recycler requires at least Recycler::PrimaryMarkStackReservedPageCount to function properly for the main mark context
    this->markContext.SetMaxPageCount(max(static_cast<size_t>(GetRecyclerFlagsTable().MaxMarkStackPageCount), static_cast<size_t>(Recycler::PrimaryMarkStackReservedPageCount)));
    this->parallelMarkContext1.SetMaxPageCount(GetRecyclerFlagsTable().MaxMarkStackPageCount);
    this->parallelMarkContext2.SetMaxPageCount(GetRecyclerFlagsTable().MaxMarkStackPageCount);
    this->parallelMarkContext3.SetMaxPageCount(GetRecyclerFlagsTable().MaxMarkStackPageCount);

    if (GetRecyclerFlagsTable().IsEnabled(Js::GCMemoryThresholdFlag))
    {
        // Note, we can't do this in the constructor for RecyclerHeuristic::Instance because it runs before config is processed
        RecyclerHeuristic::Instance.ConfigureBaseFactor(GetRecyclerFlagsTable().GCMemoryThreshold);
    }
#endif
}